

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_parser.cpp
# Opt level: O2

bool __thiscall BmsParser::Parser::IsRandomStatement(Parser *this,char *str)

{
  string *str_00;
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  _Elt_pointer pbVar4;
  string starttag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (*str != '#') {
    return false;
  }
  pcVar2 = anon_unknown_2::ParseSeparator(str + 1);
  str_00 = &this->key_;
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::assign((char *)str_00);
  }
  else {
    std::__cxx11::string::assign((char *)str_00,(ulong)(str + 1));
  }
  BmsUtil::StringToUpper(str_00);
  bVar1 = std::operator==(str_00,"RANDOM");
  if (bVar1) {
    return true;
  }
  bVar1 = std::operator==(str_00,"RONDOM");
  if (bVar1) {
    return true;
  }
  bVar1 = std::operator==(str_00,"SETRANDOM");
  if (!bVar1) {
    bVar1 = std::operator==(str_00,"ENDRANDOM");
    if (bVar1) {
      return true;
    }
    bVar1 = std::operator==(str_00,"IF");
    if (((!bVar1) && (bVar1 = std::operator==(str_00,"SWITCH"), !bVar1)) &&
       (bVar1 = std::operator==(str_00,"SETSWITCH"), !bVar1)) {
      bVar1 = std::operator==(str_00,"ENDIF");
      if ((!bVar1) && (bVar1 = std::operator==(str_00,"ENDSW"), !bVar1)) {
        sVar3 = std::
                deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->syntax_tag_);
        return sVar3 != 0;
      }
      sVar3 = std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->syntax_tag_);
      if (sVar3 != 0) {
        pbVar4 = (this->syntax_tag_).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pbVar4 == (this->syntax_tag_).
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pbVar4 = (this->syntax_tag_).
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
        }
        std::__cxx11::string::string((string *)&local_40,(string *)(pbVar4 + -1));
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(&this->syntax_tag_);
        bVar1 = std::operator==(str_00,"ENDIF");
        if ((((!bVar1) || (bVar1 = std::operator==(&local_40,"IF"), !bVar1)) &&
            ((bVar1 = std::operator==(str_00,"ENDSW"), !bVar1 ||
             (bVar1 = std::operator==(&local_40,"SWITCH"), !bVar1)))) &&
           ((bVar1 = std::operator==(str_00,"ENDSW"), !bVar1 ||
            (bVar1 = std::operator==(&local_40,"SETSWITCH"), !bVar1)))) {
          WriteLogLine(this,"%d line - start ~ end tag doesn\'t match.",(ulong)(uint)this->line_);
          this->panic_ = true;
        }
        std::__cxx11::string::~string((string *)&local_40);
        return true;
      }
      WriteLogLine(this,"%d line - end tag without start tag",(ulong)(uint)this->line_);
      this->panic_ = true;
      return false;
    }
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->syntax_tag_,str_00);
    return true;
  }
  return true;
}

Assistant:

bool IsComment(const char* str) {
			return *str != '#' || !*str;
		}